

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O0

ulong __thiscall nuraft::raft_server::get_expected_committed_log_idx(raft_server *this)

{
  uint64_t uVar1;
  bool bVar2;
  int32 iVar3;
  int iVar4;
  mapped_type *pmVar5;
  element_type *peVar6;
  ulong uVar7;
  element_type *peVar8;
  reference puVar9;
  undefined8 uVar10;
  reference pvVar11;
  element_type *peVar12;
  undefined4 extraout_var;
  element_type *peVar13;
  long in_RDI;
  uint64_t adjusted_commit_index;
  ulong m_idx;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  string tmp_str;
  size_t prev_quorum_idx;
  size_t not_responding_peers;
  size_t quorum_idx;
  int voting_members;
  ptr<peer> *p;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> *entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *__range1;
  uint64_t leader_index;
  adjust_commit_index_params aci_params;
  vector<unsigned_long,_std::allocator<unsigned_long>_> matched_indexes;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_fffffffffffffd28;
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  *in_stack_fffffffffffffd30;
  value_type vVar14;
  raft_server *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  context *in_stack_fffffffffffffd48;
  size_type in_stack_fffffffffffffd58;
  size_type sVar15;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  element_type *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  raft_server *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  raft_server *in_stack_fffffffffffffdd0;
  string local_208 [32];
  value_type local_1e8;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  unsigned_long local_180;
  unsigned_long *local_178;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_168;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  size_type local_100;
  size_t local_f8;
  size_type local_e0;
  unsigned_long *local_d0;
  unsigned_long *local_c8;
  uint local_bc;
  raft_server *local_b8;
  int32 local_ac;
  shared_ptr<nuraft::peer> *local_a8;
  reference local_a0;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_98;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_90;
  long local_88;
  uint64_t local_80;
  __int_type local_68;
  value_type local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_20;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x249f8c);
  state_machine::adjust_commit_index_params::adjust_commit_index_params
            ((adjust_commit_index_params *)0x249f99);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
            );
  std::
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  ::reserve(in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
  local_80 = get_current_leader_index(in_stack_fffffffffffffdd0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             (value_type_conflict *)in_stack_fffffffffffffd38);
  uVar1 = local_80;
  pmVar5 = std::
           unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
           ::operator[](in_stack_fffffffffffffd30,(key_type *)in_stack_fffffffffffffd28);
  *pmVar5 = uVar1;
  local_88 = in_RDI + 0x1e0;
  local_90._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::begin(in_stack_fffffffffffffd28);
  local_98._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::end(in_stack_fffffffffffffd28);
  while (bVar2 = std::__detail::operator!=(&local_90,&local_98), bVar2) {
    local_a0 = std::__detail::
               _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
               operator*((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                          *)0x24a0b2);
    local_a8 = &local_a0->second;
    peVar6 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x24a0db);
    uVar7 = peer::get_matched_idx(peVar6);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x24a10a);
    local_ac = peer::get_id((peer *)0x24a112);
    pmVar5 = std::
             unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             ::operator[](in_stack_fffffffffffffd30,(key_type *)in_stack_fffffffffffffd28);
    *pmVar5 = uVar7;
    in_stack_fffffffffffffdb7 =
         is_regular_member(in_stack_fffffffffffffd38,(ptr<peer> *)in_stack_fffffffffffffd30);
    if ((bool)in_stack_fffffffffffffdb7) {
      peVar6 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x24a1c7);
      in_stack_fffffffffffffda8 = (raft_server *)peer::get_matched_idx(peVar6);
      local_b8 = in_stack_fffffffffffffda8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd30,
                 (value_type_conflict *)in_stack_fffffffffffffd28);
    }
    std::__detail::
    _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *
               )in_stack_fffffffffffffd30);
  }
  local_bc = get_num_voting_members
                       ((raft_server *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                       );
  local_c8 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffd28);
  local_d0 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffd28);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::greater<unsigned_long>>
            (local_c8,local_d0);
  iVar3 = get_quorum_for_commit(in_stack_fffffffffffffda8);
  local_e0 = (size_type)iVar3;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x24a2aa);
  nuraft::context::get_params(in_stack_fffffffffffffd48);
  peVar8 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x24a2c9);
  bVar2 = peVar8->use_full_consensus_among_healthy_members_;
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x24a2dd);
  if ((bVar2 & 1U) != 0) {
    local_f8 = get_not_responding_peers
                         ((raft_server *)
                          CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    if (local_f8 < (long)(int)local_bc - local_e0) {
      local_100 = local_e0;
      local_e0 = ((long)(int)local_bc - local_f8) - 1;
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar13 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x24a388);
        iVar4 = (*peVar13->_vptr_logger[7])();
        if (5 < iVar4) {
          peVar13 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x24a3bb);
          msg_if_given_abi_cxx11_
                    ((char *)local_120,
                     "full consensus mode: %zu peers are not responding out of %d, adjust quorum %zu -> %zu"
                     ,local_f8,(ulong)local_bc,local_100,local_e0);
          (*peVar13->_vptr_logger[8])
                    (peVar13,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"get_expected_committed_log_idx",0x4a5,local_120);
          std::__cxx11::string::~string(local_120);
        }
      }
    }
    else {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar13 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x24a493);
        iVar4 = (*peVar13->_vptr_logger[7])();
        if (5 < iVar4) {
          in_stack_fffffffffffffd68 =
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x24a4c6);
          msg_if_given_abi_cxx11_
                    ((char *)local_140,
                     "full consensus mode, but %zu peers are not responding, required quorum size %zu/%d"
                     ,local_f8,local_e0 + 1,(ulong)local_bc);
          (*in_stack_fffffffffffffd68->_vptr_logger[8])
                    (in_stack_fffffffffffffd68,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"get_expected_committed_log_idx",0x4a9,local_140);
          std::__cxx11::string::~string(local_140);
        }
      }
    }
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar2) {
    peVar13 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x24a599);
    iVar4 = (*peVar13->_vptr_logger[7])();
    if (5 < iVar4) {
      std::__cxx11::string::string(local_160);
      local_168 = &local_20;
      local_170._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffd28);
      local_178 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffd28);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffd30,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffd28), bVar2) {
        puVar9 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_170);
        local_180 = *puVar9;
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd68);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30);
        std::__cxx11::string::operator+=(local_160,local_1a0);
        std::__cxx11::string::~string(local_1a0);
        std::__cxx11::string::~string(local_1c0);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_170);
      }
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar13 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x24a740);
        iVar4 = (*peVar13->_vptr_logger[7])();
        if (5 < iVar4) {
          peVar13 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x24a773);
          sVar15 = local_e0;
          uVar10 = std::__cxx11::string::c_str();
          msg_if_given_abi_cxx11_((char *)local_1e0,"quorum idx %zu, %s",sVar15,uVar10);
          (*peVar13->_vptr_logger[8])
                    (peVar13,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"get_expected_committed_log_idx",0x4b2,local_1e0);
          std::__cxx11::string::~string(local_1e0);
        }
      }
      std::__cxx11::string::~string(local_160);
    }
  }
  local_68 = std::__atomic_base::operator_cast_to_unsigned_long
                       ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffd38);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (&local_20,local_e0);
  local_60 = *pvVar11;
  peVar12 = std::
            __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x24a886);
  iVar4 = (*peVar12->_vptr_state_machine[0x15])(peVar12,&local_68);
  local_1e8 = CONCAT44(extraout_var,iVar4);
  if ((local_60 != local_1e8) &&
     (bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318)), bVar2)) {
    peVar13 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x24a8f8);
    in_stack_fffffffffffffd44 = (*peVar13->_vptr_logger[7])();
    if (5 < in_stack_fffffffffffffd44) {
      peVar13 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x24a92b);
      msg_if_given_abi_cxx11_
                ((char *)local_208,"commit index adjusted: %lu -> %lu",local_60,local_1e8);
      (*peVar13->_vptr_logger[8])
                (peVar13,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"get_expected_committed_log_idx",0x4ba,local_208);
      std::__cxx11::string::~string(local_208);
    }
  }
  vVar14 = local_1e8;
  state_machine::adjust_commit_index_params::~adjust_commit_index_params
            ((adjust_commit_index_params *)0x24a9d7);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  return vVar14;
}

Assistant:

ulong raft_server::get_expected_committed_log_idx() {
    std::vector<ulong> matched_indexes;
    state_machine::adjust_commit_index_params aci_params;
    matched_indexes.reserve(16);
    aci_params.peer_index_map_.reserve(16);

    // Put the index of leader itself.
    uint64_t leader_index = get_current_leader_index();
    matched_indexes.push_back( leader_index );
    aci_params.peer_index_map_[id_] = leader_index;

    for (auto& entry: peers_) {
        ptr<peer>& p = entry.second;
        aci_params.peer_index_map_[p->get_id()] = p->get_matched_idx();

        if (!is_regular_member(p)) continue;
        matched_indexes.push_back( p->get_matched_idx() );
    }
    int voting_members = get_num_voting_members();
    assert((int32)matched_indexes.size() == voting_members);

    // NOTE: Descending order.
    //       e.g.) 100 100 99 95 92
    //             => commit on 99 if `quorum_idx == 2`.
    std::sort( matched_indexes.begin(),
               matched_indexes.end(),
               std::greater<ulong>() );

    size_t quorum_idx = get_quorum_for_commit();
    if (ctx_->get_params()->use_full_consensus_among_healthy_members_) {
        size_t not_responding_peers = get_not_responding_peers();
        if (not_responding_peers < voting_members - quorum_idx) {
            // If full consensus option is on, commit should be
            // agreed by all healthy members, and the number of
            // aggreed members should be bigger than regular quorum size.
            size_t prev_quorum_idx = quorum_idx;
            quorum_idx = voting_members - not_responding_peers - 1;
            p_tr( "full consensus mode: %zu peers are not responding out of %d, "
                  "adjust quorum %zu -> %zu",
                  not_responding_peers, voting_members,
                  prev_quorum_idx, quorum_idx );
        } else {
            p_tr( "full consensus mode, but %zu peers are not responding, "
                  "required quorum size %zu/%d",
                  not_responding_peers, quorum_idx + 1, voting_members );
        }
    }

    if (l_ && l_->get_level() >= 6) {
        std::string tmp_str;
        for (ulong m_idx: matched_indexes) {
            tmp_str += std::to_string(m_idx) + " ";
        }
        p_tr("quorum idx %zu, %s", quorum_idx, tmp_str.c_str());
    }

    aci_params.current_commit_index_ = quick_commit_index_;
    aci_params.expected_commit_index_ = matched_indexes[quorum_idx];
    uint64_t adjusted_commit_index = state_machine_->adjust_commit_index(aci_params);
    if (aci_params.expected_commit_index_ != adjusted_commit_index) {
        p_tr( "commit index adjusted: %" PRIu64 " -> %" PRIu64,
              aci_params.expected_commit_index_, adjusted_commit_index );
    }
    return adjusted_commit_index;
}